

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderStateQueryTests.cpp
# Opt level: O2

void deqp::gles3::Functional::anon_unknown_0::verifyCurrentVertexAttribf
               (TestContext *testCtx,CallLogWrapper *gl,GLint index,GLfloat x,GLfloat y,GLfloat z,
               GLfloat w)

{
  ostringstream *this;
  undefined1 auVar1 [16];
  bool bVar2;
  int iVar3;
  undefined7 extraout_var;
  StateQueryMemoryWriteGuard<float[4]> attribValue;
  undefined1 local_1a8 [384];
  
  deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<float[4]>::StateQueryMemoryWriteGuard
            (&attribValue);
  glu::CallLogWrapper::glGetVertexAttribfv(gl,index,0x8626,attribValue.m_value);
  bVar2 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<float[4]>::verifyValidity
                    (&attribValue,testCtx);
  auVar1._4_4_ = -(uint)(y != attribValue.m_value[1]);
  auVar1._0_4_ = -(uint)(x != attribValue.m_value[0]);
  auVar1._8_4_ = -(uint)(z != attribValue.m_value[2]);
  auVar1._12_4_ = -(uint)(w != attribValue.m_value[3]);
  iVar3 = movmskps((int)CONCAT71(extraout_var,bVar2),auVar1);
  if (iVar3 != 0) {
    local_1a8._0_8_ = testCtx->m_log;
    this = (ostringstream *)(local_1a8 + 8);
    std::__cxx11::ostringstream::ostringstream(this);
    std::operator<<((ostream *)this,"// ERROR: Expected [");
    std::ostream::operator<<(this,x);
    std::operator<<((ostream *)this,",");
    std::ostream::operator<<(this,y);
    std::operator<<((ostream *)this,",");
    std::ostream::operator<<(this,z);
    std::operator<<((ostream *)this,",");
    std::ostream::operator<<(this,w);
    std::operator<<((ostream *)this,"];");
    std::operator<<((ostream *)this,"got [");
    std::ostream::operator<<(this,attribValue.m_value[0]);
    std::operator<<((ostream *)this,",");
    std::ostream::operator<<(this,attribValue.m_value[1]);
    std::operator<<((ostream *)this,",");
    std::ostream::operator<<(this,attribValue.m_value[2]);
    std::operator<<((ostream *)this,",");
    std::ostream::operator<<(this,attribValue.m_value[3]);
    std::operator<<((ostream *)this,"]");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this);
    if (testCtx->m_testResult == QP_TEST_RESULT_PASS) {
      tcu::TestContext::setTestResult(testCtx,QP_TEST_RESULT_FAIL,"got invalid attribute value");
    }
  }
  return;
}

Assistant:

void verifyCurrentVertexAttribf (tcu::TestContext& testCtx, glu::CallLogWrapper& gl, GLint index, GLfloat x, GLfloat y, GLfloat z, GLfloat w)
{
	using tcu::TestLog;

	StateQueryMemoryWriteGuard<GLfloat[4]> attribValue;
	gl.glGetVertexAttribfv(index, GL_CURRENT_VERTEX_ATTRIB, attribValue);

	attribValue.verifyValidity(testCtx);

	if (attribValue[0] != x || attribValue[1] != y || attribValue[2] != z || attribValue[3] != w)
	{
		testCtx.getLog() << TestLog::Message
			<< "// ERROR: Expected [" << x << "," << y << "," << z << "," << w << "];"
			<< "got [" << attribValue[0] << "," << attribValue[1] << "," << attribValue[2] << "," << attribValue[3] << "]"
			<< TestLog::EndMessage;
		if (testCtx.getTestResult() == QP_TEST_RESULT_PASS)
			testCtx.setTestResult(QP_TEST_RESULT_FAIL, "got invalid attribute value");
	}
}